

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_python_converter.hpp
# Opt level: O0

void __thiscall
boost::python::to_python_converter<std::vector<int,_std::allocator<int>_>,_vecToList<int>,_false>::
to_python_converter(to_python_converter<std::vector<int,_std::allocator<int>_>,_vecToList<int>,_false>
                    *this)

{
  type_info tVar1;
  
  tVar1 = type_id<std::vector<int,std::allocator<int>>>();
  converter::registry::insert
            (converter::
             as_to_python_function<std::vector<int,_std::allocator<int>_>,_vecToList<int>_>::convert
             ,tVar1,get_pytype_impl);
  return;
}

Assistant:

to_python_converter<T,Conversion, has_get_pytype>::to_python_converter()
{
    typedef converter::as_to_python_function<
        T, Conversion
        > normalized;
            
    converter::registry::insert(
        &normalized::convert
        , type_id<T>()
#ifndef BOOST_PYTHON_NO_PY_SIGNATURES
        , &get_pytype_impl
#endif
        );
}